

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O3

int Bal_ManDeriveCuts(Bal_Man_t *p,int iFan0,int iFan1,int iFan2,int fCompl0,int fCompl1,int fCompl2
                     ,int fUnit0,int fUnit1,int fUnit2,int fIsXor,int Target,int fSave)

{
  Vec_Ptr_t *pVVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  undefined8 *puVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  undefined8 *puVar11;
  void **ppvVar12;
  uint *puVar13;
  long lVar14;
  ulong uVar15;
  undefined8 *puVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong *puVar22;
  uint uVar23;
  uint uVar24;
  byte bVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  ulong *puVar29;
  ulong uVar30;
  undefined1 *puVar31;
  int iVar32;
  int nSizeC;
  int iVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 *__s;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  Bal_Cut_t *pCutsR [8];
  Bal_Cut_t pCutSet [8];
  ulong local_208;
  ulong *local_1f8;
  ulong *local_1e8;
  Bal_Cut_t *local_1b8;
  long local_1b0 [7];
  undefined1 local_178 [328];
  long lVar41;
  
  if ((-1 < iFan0) && (pVVar1 = p->vCutSets, iFan0 < pVVar1->nSize)) {
    if ((fUnit0 == 0) &&
       (puVar31 = (undefined1 *)pVVar1->pArray[(uint)iFan0], (ulong *)puVar31 != (ulong *)0x0)) {
      uVar28 = p->nCutNum;
      if ((int)uVar28 < 1) {
        uVar21 = 0;
      }
      else {
        puVar13 = (uint *)((long)puVar31 + 0xc);
        uVar21 = 0;
        do {
          if (0xf7ffffff < *puVar13) goto LAB_0070f005;
          uVar21 = uVar21 + 1;
          puVar13 = puVar13 + 10;
        } while (uVar28 != uVar21);
        uVar21 = (ulong)uVar28;
      }
    }
    else {
      if (p->vCosts->nSize <= iFan0) goto LAB_0070fc7c;
      Bal_ManPrepareSet_CutTemp._8_4_ = (p->vCosts->pArray[(uint)iFan0] >> 4) + 1;
      puVar31 = Bal_ManPrepareSet_CutTemp;
      Bal_ManPrepareSet_CutTemp._0_8_ = 1L << ((byte)iFan0 & 0x3f);
      Bal_ManPrepareSet_CutTemp._12_4_ = 0x8000002;
      uVar21 = 1;
      Bal_ManPrepareSet_CutTemp._16_4_ = iFan0;
    }
LAB_0070f005:
    if ((iFan1 < 0) || (pVVar1->nSize <= iFan1)) goto LAB_0070fc5d;
    if ((fUnit1 == 0) &&
       (local_1f8 = (ulong *)pVVar1->pArray[(uint)iFan1], local_1f8 != (ulong *)0x0)) {
      uVar28 = p->nCutNum;
      uVar30 = (ulong)uVar28;
      if ((int)uVar28 < 1) {
        uVar19 = 0;
      }
      else {
        puVar13 = (uint *)((long)local_1f8 + 0xc);
        uVar19 = 0;
        do {
          if (0xf7ffffff < *puVar13) goto LAB_0070f0c5;
          uVar19 = uVar19 + 1;
          puVar13 = puVar13 + 10;
        } while (uVar30 != uVar19);
        uVar19 = (ulong)uVar28;
      }
    }
    else {
      if (p->vCosts->nSize <= iFan1) goto LAB_0070fc7c;
      Bal_ManPrepareSet_CutTemp._48_4_ = (p->vCosts->pArray[(uint)iFan1] >> 4) + 1;
      Bal_ManPrepareSet_CutTemp._52_4_ = 0x8000002;
      Bal_ManPrepareSet_CutTemp._40_8_ = 1L << ((byte)iFan1 & 0x3f);
      local_1f8 = (ulong *)(Bal_ManPrepareSet_CutTemp + 0x28);
      uVar30 = (ulong)(uint)p->nCutNum;
      uVar19 = 1;
      Bal_ManPrepareSet_CutTemp._56_4_ = iFan1;
    }
LAB_0070f0c5:
    iVar27 = (int)uVar30;
    iVar33 = (int)uVar21;
    iVar17 = (int)uVar19;
    __s = local_178;
    memset(__s,0,(long)iVar27 * 0x28);
    if (0 < iVar27) {
      lVar14 = uVar30 - 1;
      auVar39._8_4_ = (int)lVar14;
      auVar39._0_8_ = lVar14;
      auVar39._12_4_ = (int)((ulong)lVar14 >> 0x20);
      lVar14 = 0;
      auVar39 = auVar39 ^ _DAT_0094e250;
      auVar40 = _DAT_0094e240;
      do {
        auVar42 = auVar40 ^ _DAT_0094e250;
        if ((bool)(~(auVar42._4_4_ == auVar39._4_4_ && auVar39._0_4_ < auVar42._0_4_ ||
                    auVar39._4_4_ < auVar42._4_4_) & 1)) {
          *(undefined1 **)((long)local_1b0 + lVar14 + -8) = __s;
        }
        if ((auVar42._12_4_ != auVar39._12_4_ || auVar42._8_4_ <= auVar39._8_4_) &&
            auVar42._12_4_ <= auVar39._12_4_) {
          *(undefined1 **)((long)local_1b0 + lVar14) = __s + 0x28;
        }
        lVar41 = auVar40._8_8_;
        auVar40._0_8_ = auVar40._0_8_ + 2;
        auVar40._8_8_ = lVar41 + 2;
        lVar14 = lVar14 + 0x10;
        __s = __s + 0x50;
      } while ((ulong)(iVar27 + 1U >> 1) << 4 != lVar14);
    }
    puVar4 = (ulong *)((long)puVar31 + (long)iVar33 * 5 * 8);
    if (iFan2 < 1) {
      if (iVar33 < 1) {
        return -1;
      }
      uVar28 = 0;
      do {
        puVar22 = local_1f8;
        if (0 < iVar17) {
          do {
            uVar21 = (*puVar22 | *(ulong *)puVar31) -
                     ((*puVar22 | *(ulong *)puVar31) >> 1 & 0x5555555555555555);
            uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333);
            uVar24 = p->nLutSize;
            if ((int)(uint)(byte)(((uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                 >> 0x38) <= (int)uVar24) {
              puVar29 = (ulong *)local_1b0[(long)(int)uVar28 + -1];
              uVar35 = *(uint *)((long)puVar31 + 0xc);
              uVar26 = uVar35 >> 0x1b;
              uVar20 = *(uint *)((long)puVar22 + 0xc);
              uVar23 = uVar20 >> 0x1b;
              if ((uVar26 == uVar24) && (uVar23 == uVar24)) {
                if (0x7ffffff < uVar35) {
                  uVar21 = 0;
                  do {
                    iVar27 = *(int *)((long)puVar31 + uVar21 * 4 + 0x10);
                    if (iVar27 != *(int *)((long)puVar22 + uVar21 * 4 + 0x10)) goto LAB_0070f53a;
                    *(int *)((long)puVar29 + uVar21 * 4 + 0x10) = iVar27;
                    uVar21 = uVar21 + 1;
                  } while (uVar24 != uVar21);
                }
LAB_0070f420:
                *(uint *)((long)puVar29 + 0xc) = uVar24 * 0x8000000 + 0x7ffffff;
                uVar21 = *puVar22;
                uVar30 = *(ulong *)puVar31;
                *puVar29 = uVar21 | uVar30;
                iVar27 = (int)puVar22[1];
                if ((int)puVar22[1] < (int)*(ulong *)((long)puVar31 + 8)) {
                  iVar27 = (int)*(ulong *)((long)puVar31 + 8);
                }
                *(int *)(puVar29 + 1) = iVar27;
                if (iVar27 != Target) {
                  __assert_fail("pCutsR[nCutsR]->Delay == Target",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                                ,0x1bc,
                                "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                               );
                }
                if (0 < (int)uVar28) {
                  uVar35 = uVar24 & 0x1f;
                  uVar19 = 0;
                  do {
                    puVar2 = (ulong *)local_1b0[uVar19 - 1];
                    uVar20 = *(uint *)((long)puVar2 + 0xc) >> 0x1b;
                    if ((uVar20 <= uVar35) && ((*puVar2 & ~(uVar21 | uVar30)) == 0)) {
                      if (uVar35 == uVar20) {
                        if (uVar24 * 0x8000000 == 0) goto LAB_0070f53a;
                        uVar36 = 0;
                        while (*(int *)((long)puVar29 + uVar36 * 4 + 0x10) ==
                               *(int *)((long)puVar2 + uVar36 * 4 + 0x10)) {
                          uVar36 = uVar36 + 1;
                          if (uVar35 == uVar36) goto LAB_0070f53a;
                        }
                      }
                      else {
                        if (uVar35 <= uVar20) {
LAB_0070fbe1:
                          __assert_fail("nSizeB > nSizeC",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                                        ,0x143,
                                        "int Bal_SetCutIsContainedOrder(Bal_Cut_t *, Bal_Cut_t *)");
                        }
                        if (*(uint *)((long)puVar2 + 0xc) < 0x8000000) goto LAB_0070f53a;
                        uVar36 = 0;
                        uVar26 = 0;
                        do {
                          iVar27 = *(int *)((long)puVar2 + (long)(int)uVar26 * 4 + 0x10);
                          iVar33 = *(int *)((long)puVar29 + uVar36 * 4 + 0x10);
                          if (iVar27 < iVar33) break;
                          if ((iVar33 == iVar27) && (uVar26 = uVar26 + 1, uVar26 == uVar20))
                          goto LAB_0070f53a;
                          uVar36 = uVar36 + 1;
                        } while (uVar35 != uVar36);
                      }
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar19 != uVar28);
                }
                uVar28 = Bal_SetAddCut(&local_1b8,uVar28,p->nCutNum);
              }
              else if (uVar24 != 0) {
                uVar21 = 0;
                iVar33 = 0;
                iVar27 = 0;
LAB_0070f334:
                iVar32 = *(int *)((long)puVar31 + (long)iVar33 * 4 + 0x10);
                iVar10 = *(int *)((long)puVar22 + (long)iVar27 * 4 + 0x10);
                iVar18 = (int)uVar21;
                if (iVar32 < iVar10) {
                  iVar33 = iVar33 + 1;
                  *(int *)((long)puVar29 + uVar21 * 4 + 0x10) = iVar32;
                  iVar32 = iVar27;
                  if (iVar33 < (int)uVar26) goto LAB_0070f381;
LAB_0070f3bd:
                  if ((int)((uVar20 >> 0x1b) + iVar18 + 1) <= (int)(uVar24 + iVar32)) {
                    if (iVar32 < (int)uVar23) {
                      uVar30 = (ulong)iVar32;
                      do {
                        lVar14 = uVar30 * 4;
                        uVar30 = uVar30 + 1;
                        *(undefined4 *)((long)puVar29 + uVar21 * 4 + 0x14) =
                             *(undefined4 *)((long)puVar22 + lVar14 + 0x10);
                        uVar21 = uVar21 + 1;
                      } while (uVar23 != uVar30);
                      goto LAB_0070f417;
                    }
LAB_0070f41e:
                    uVar24 = iVar18 + 1;
                    goto LAB_0070f420;
                  }
                }
                else {
                  if (iVar10 < iVar32) {
                    *(int *)((long)puVar29 + uVar21 * 4 + 0x10) = iVar10;
                  }
                  else {
                    iVar33 = iVar33 + 1;
                    *(int *)((long)puVar29 + uVar21 * 4 + 0x10) = iVar32;
                    iVar32 = iVar27 + 1;
                    if ((int)uVar26 <= iVar33) goto LAB_0070f3bd;
                  }
                  iVar27 = iVar27 + 1;
                  if (iVar27 < (int)uVar23) goto LAB_0070f381;
                  if ((int)((uVar35 >> 0x1b) + iVar18 + 1) <= (int)(uVar24 + iVar33)) {
                    if (iVar33 < (int)uVar26) {
                      uVar30 = (ulong)iVar33;
                      do {
                        lVar14 = uVar30 * 4;
                        uVar30 = uVar30 + 1;
                        *(undefined4 *)((long)puVar29 + uVar21 * 4 + 0x14) =
                             *(undefined4 *)((long)puVar31 + lVar14 + 0x10);
                        uVar21 = uVar21 + 1;
                      } while (uVar26 != uVar30);
LAB_0070f417:
                      iVar18 = (int)uVar21;
                    }
                    goto LAB_0070f41e;
                  }
                }
              }
            }
LAB_0070f53a:
            puVar22 = puVar22 + 5;
          } while (puVar22 < local_1f8 + (long)iVar17 * 5);
        }
        puVar31 = (undefined1 *)((long)puVar31 + 0x28);
      } while (puVar31 < puVar4);
    }
    else {
      if (p->vCutSets->nSize <= iFan2) goto LAB_0070fc5d;
      if ((fUnit2 == 0) &&
         (local_1e8 = (ulong *)p->vCutSets->pArray[(uint)iFan2], local_1e8 != (ulong *)0x0)) {
        if (iVar27 < 1) {
          local_208 = 0;
        }
        else {
          puVar13 = (uint *)((long)local_1e8 + 0xc);
          local_208 = 0;
          uVar21 = local_208;
          do {
            local_208 = uVar21;
            if (0xf7ffffff < *puVar13) break;
            uVar21 = local_208 + 1;
            puVar13 = puVar13 + 10;
            local_208 = uVar30;
          } while (uVar30 != uVar21);
        }
      }
      else {
        if (p->vCosts->nSize <= iFan2) {
LAB_0070fc7c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Bal_ManPrepareSet_CutTemp._88_4_ = (p->vCosts->pArray[(uint)iFan2] >> 4) + 1;
        Bal_ManPrepareSet_CutTemp._92_4_ = 0x8000002;
        Bal_ManPrepareSet_CutTemp._80_8_ = 1L << ((byte)iFan2 & 0x3f);
        local_208 = 1;
        local_1e8 = (ulong *)(Bal_ManPrepareSet_CutTemp + 0x50);
        Bal_ManPrepareSet_CutTemp._96_4_ = iFan2;
      }
      if (iVar33 < 1) {
        return -1;
      }
      uVar28 = 0;
      do {
        puVar22 = local_1f8;
        if (0 < iVar17) {
          do {
            puVar29 = local_1e8;
            if (0 < (int)local_208) {
LAB_0070f630:
              uVar21 = *puVar22 | *(ulong *)puVar31 | *puVar29;
              uVar21 = uVar21 - (uVar21 >> 1 & 0x5555555555555555);
              uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333);
              uVar24 = p->nLutSize;
              if ((int)(uint)(byte)(((uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                   >> 0x38) <= (int)uVar24) {
                puVar2 = (ulong *)local_1b0[(long)(int)uVar28 + -1];
                uVar35 = *(uint *)((long)puVar31 + 0xc);
                uVar20 = *(uint *)((long)puVar22 + 0xc);
                uVar26 = *(uint *)((long)puVar29 + 0xc);
                bVar25 = 0;
                iVar27 = -0x7ffffff;
                uVar21 = 0;
                uVar34 = 0;
                uVar30 = 0;
                uVar23 = 0;
                while( true ) {
                  iVar32 = 1000000000;
                  iVar33 = 1000000000;
                  if (uVar23 != uVar35 >> 0x1b) {
                    iVar33 = *(int *)((long)puVar31 + (ulong)uVar23 * 4 + 0x10);
                  }
                  if ((uint)uVar30 != uVar20 >> 0x1b) {
                    iVar32 = *(int *)((long)puVar22 + uVar30 * 4 + 0x10);
                  }
                  iVar10 = 1000000000;
                  if (uVar34 != uVar26 >> 0x1b) {
                    iVar10 = *(int *)((long)puVar29 + (ulong)uVar34 * 4 + 0x10);
                  }
                  iVar18 = iVar32;
                  if (iVar33 < iVar32) {
                    iVar18 = iVar33;
                  }
                  iVar6 = iVar10;
                  if (iVar18 < iVar10) {
                    iVar6 = iVar18;
                  }
                  if (iVar6 == 1000000000) {
                    *(int *)((long)puVar2 + 0xc) = -iVar27;
                    uVar30 = *puVar22 | *(ulong *)puVar31 | *puVar29;
                    *puVar2 = uVar30;
                    iVar33 = (int)puVar29[1];
                    if ((int)puVar29[1] < (int)puVar22[1]) {
                      iVar33 = (int)puVar22[1];
                    }
                    if (iVar33 < (int)*(ulong *)((long)puVar31 + 8)) {
                      iVar33 = (int)*(ulong *)((long)puVar31 + 8);
                    }
                    *(int *)(puVar2 + 1) = iVar33;
                    if (iVar33 != Target) {
                      __assert_fail("pCutsR[nCutsR]->Delay == Target",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                                    ,0x1ab,
                                    "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                                   );
                    }
                    if ((int)uVar28 < 1) goto LAB_0070f867;
                    uVar24 = (uint)uVar21 & 0x1f;
                    uVar21 = 0;
                    goto LAB_0070f7da;
                  }
                  if (uVar24 == uVar21) break;
                  *(int *)((long)puVar2 + uVar21 * 4 + 0x10) = iVar6;
                  uVar21 = uVar21 + 1;
                  uVar23 = uVar23 + (iVar33 == iVar6);
                  uVar30 = (ulong)((uint)uVar30 + (uint)(iVar32 == iVar6));
                  uVar34 = uVar34 + (iVar10 <= iVar18);
                  iVar27 = iVar27 + -0x8000000;
                  bVar25 = bVar25 + 1;
                }
              }
              goto LAB_0070f8bc;
            }
LAB_0070f8ce:
            puVar22 = puVar22 + 5;
          } while (puVar22 < local_1f8 + (long)iVar17 * 5);
        }
        puVar31 = (undefined1 *)((long)puVar31 + 0x28);
      } while (puVar31 < puVar4);
    }
    if (uVar28 == 0) {
      return -1;
    }
    if (((int)uVar28 < 1) || (p->nCutNum <= (int)uVar28)) {
      __assert_fail("nCutsR > 0 && nCutsR < p->nCutNum",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                    ,0x1c9,
                    "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    uVar24 = *(uint *)&local_1b8->field_0xc >> 0x1b | local_1b8->Delay << 4;
    uVar30 = (ulong)uVar28;
    uVar21 = 0;
    do {
      puVar4 = (ulong *)local_1b0[uVar21 - 1];
      uVar35 = *(uint *)((long)puVar4 + 0xc);
      if (0x37ffffff < uVar35) {
        __assert_fail("pCut0->nLeaves <= BAL_LEAF_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                      ,0xc0,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
      }
      uVar19 = (ulong)(uVar35 >> 0x1b);
      if (uVar35 < 0x8000000) {
        if (*puVar4 != 0) {
LAB_0070fc1f:
          __assert_fail("pCut0->Sign == Bal_CutGetSign(pCut0->pLeaves, pCut0->nLeaves)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                        ,0xc1,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
        }
      }
      else {
        uVar37 = 0;
        uVar36 = 0;
        do {
          uVar36 = uVar36 | 1L << ((ulong)*(byte *)((long)puVar4 + uVar37 * 4 + 0x10) & 0x3f);
          uVar37 = uVar37 + 1;
        } while (uVar19 != uVar37);
        if (*puVar4 != uVar36) goto LAB_0070fc1f;
        lVar14 = (long)puVar4 + 0x14;
        uVar37 = 0;
        uVar36 = uVar19;
        do {
          uVar36 = uVar36 - 1;
          uVar38 = uVar37 + 1;
          if (uVar38 < uVar19) {
            uVar15 = 0;
            do {
              if (*(int *)(lVar14 + uVar15 * 4) <= *(int *)((long)puVar4 + uVar37 * 4 + 0x10)) {
                __assert_fail("pCut0->pLeaves[m] < pCut0->pLeaves[n]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                              ,0xc5,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
              }
              uVar15 = uVar15 + 1;
            } while (uVar36 != uVar15);
          }
          lVar14 = lVar14 + 4;
          uVar37 = uVar38;
        } while (uVar38 != uVar19);
      }
      uVar36 = 0;
      do {
        puVar22 = (ulong *)local_1b0[uVar36 - 1];
        if (puVar4 != puVar22) {
          if (*(uint *)((long)puVar22 + 0xc) < 0x8000000) {
LAB_0070fbc2:
            __assert_fail("Value == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                          ,0xce,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
          }
          uVar37 = 0;
          while( true ) {
            uVar38 = 0;
            if (0x7ffffff < uVar35) {
              uVar38 = 0;
              while (*(int *)((long)puVar22 + uVar37 * 4 + 0x10) !=
                     *(int *)((long)puVar4 + uVar38 * 4 + 0x10)) {
                uVar38 = uVar38 + 1;
                if (uVar19 == uVar38) goto LAB_0070fa16;
              }
            }
            if ((uint)uVar38 == uVar35 >> 0x1b) break;
            uVar37 = uVar37 + 1;
            if (uVar37 == *(uint *)((long)puVar22 + 0xc) >> 0x1b) goto LAB_0070fbc2;
          }
        }
LAB_0070fa16:
        uVar36 = uVar36 + 1;
      } while (uVar36 != uVar30);
      uVar21 = uVar21 + 1;
      if (uVar21 == uVar30) {
        if (fSave == 0) {
          return uVar24;
        }
        if (-1 < local_1b8->Delay << 4) {
          puVar11 = (undefined8 *)calloc((long)p->nCutNum,0x28);
          pVVar1 = p->vCutSets;
          uVar35 = pVVar1->nSize;
          if (uVar35 == pVVar1->nCap) {
            if ((int)uVar35 < 0x10) {
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar12 = (void **)malloc(0x80);
              }
              else {
                ppvVar12 = (void **)realloc(pVVar1->pArray,0x80);
              }
              pVVar1->pArray = ppvVar12;
              pVVar1->nCap = 0x10;
            }
            else {
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar12 = (void **)malloc((ulong)uVar35 << 4);
              }
              else {
                ppvVar12 = (void **)realloc(pVVar1->pArray,(ulong)uVar35 << 4);
              }
              pVVar1->pArray = ppvVar12;
              pVVar1->nCap = uVar35 * 2;
            }
          }
          else {
            ppvVar12 = pVVar1->pArray;
          }
          iVar27 = pVVar1->nSize;
          pVVar1->nSize = iVar27 + 1;
          ppvVar12[iVar27] = puVar11;
          if (p->vCutSets->nSize != p->pNew->nObjs) {
            __assert_fail("Vec_PtrSize(p->vCutSets) == Gia_ManObjNum(p->pNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                          ,0x1d0,
                          "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                         );
          }
          uVar21 = 0;
          puVar16 = puVar11;
          do {
            puVar5 = (undefined8 *)local_1b0[uVar21 - 1];
            puVar16[4] = puVar5[4];
            uVar7 = *puVar5;
            uVar8 = puVar5[1];
            uVar9 = puVar5[3];
            puVar16[2] = puVar5[2];
            puVar16[3] = uVar9;
            *puVar16 = uVar7;
            puVar16[1] = uVar8;
            uVar21 = uVar21 + 1;
            puVar16 = puVar16 + 5;
          } while (uVar30 != uVar21);
          iVar27 = p->nCutNum;
          if ((int)uVar28 < iVar27) {
            lVar14 = (long)puVar11 + uVar30 * 0x28 + 0xc;
            do {
              *(byte *)(lVar14 + 3) = *(byte *)(lVar14 + 3) | 0xf8;
              lVar14 = lVar14 + 0x28;
              uVar28 = uVar28 + 1;
            } while ((int)uVar28 < iVar27);
          }
          Vec_IntPush(p->vCosts,uVar24);
          if (p->vCosts->nSize != p->pNew->nObjs) {
            __assert_fail("Vec_IntSize(p->vCosts) == Gia_ManObjNum(p->pNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalLut.c"
                          ,0x1d6,
                          "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                         );
          }
          return uVar24;
        }
        return uVar24;
      }
    } while( true );
  }
LAB_0070fc5d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
LAB_0070f381:
  uVar21 = uVar21 + 1;
  if (uVar24 == uVar21) goto LAB_0070f53a;
  goto LAB_0070f334;
LAB_0070f7da:
  do {
    puVar3 = (ulong *)local_1b0[uVar21 - 1];
    uVar35 = *(uint *)((long)puVar3 + 0xc) >> 0x1b;
    if ((uVar35 <= uVar24) && ((*puVar3 & ~uVar30) == 0)) {
      if (uVar24 == uVar35) {
        if (iVar27 == -0x7ffffff) goto LAB_0070f8bc;
        uVar19 = 0;
        while (*(int *)((long)puVar2 + uVar19 * 4 + 0x10) ==
               *(int *)((long)puVar3 + uVar19 * 4 + 0x10)) {
          uVar19 = uVar19 + 1;
          if ((bVar25 & 0x1f) == uVar19) goto LAB_0070f8bc;
        }
      }
      else {
        if (uVar24 <= uVar35) goto LAB_0070fbe1;
        if (*(uint *)((long)puVar3 + 0xc) < 0x8000000) goto LAB_0070f8bc;
        uVar19 = 0;
        uVar20 = 0;
        do {
          iVar33 = *(int *)((long)puVar3 + (long)(int)uVar20 * 4 + 0x10);
          iVar32 = *(int *)((long)puVar2 + uVar19 * 4 + 0x10);
          if (iVar33 < iVar32) break;
          if ((iVar32 == iVar33) && (uVar20 = uVar20 + 1, uVar20 == uVar35)) goto LAB_0070f8bc;
          uVar19 = uVar19 + 1;
        } while ((bVar25 & 0x1f) != uVar19);
      }
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != uVar28);
LAB_0070f867:
  uVar28 = Bal_SetAddCut(&local_1b8,uVar28,p->nCutNum);
LAB_0070f8bc:
  puVar29 = puVar29 + 5;
  if (local_1e8 + (long)(int)local_208 * 5 <= puVar29) goto LAB_0070f8ce;
  goto LAB_0070f630;
}

Assistant:

int Bal_ManDeriveCuts( Bal_Man_t * p, int iFan0, int iFan1, int iFan2, int fCompl0, int fCompl1, int fCompl2, int fUnit0, int fUnit1, int fUnit2, int fIsXor, int Target, int fSave )
{
    Bal_Cut_t pCutSet[BAL_CUT_MAX], * pCutsR[BAL_CUT_MAX];
    Bal_Cut_t * pCutSet0, * pCutSet1, * pCutSet2;
    int nCuts0 = Bal_ManPrepareSet( p, iFan0, 0, fUnit0, &pCutSet0 );
    int nCuts1 = Bal_ManPrepareSet( p, iFan1, 1, fUnit1, &pCutSet1 );
    Bal_Cut_t * pCut0, * pCut0Lim = pCutSet0 + nCuts0;
    Bal_Cut_t * pCut1, * pCut1Lim = pCutSet1 + nCuts1;
    int i, Cost, nCutsR = 0;
    memset( pCutSet, 0, sizeof(Bal_Cut_t) * p->nCutNum );
    for ( i = 0; i < p->nCutNum; i++ )
        pCutsR[i] = pCutSet + i;
    // enumerate cuts
    if ( iFan2 > 0 )
    {
        int nCuts2 = Bal_ManPrepareSet( p, iFan2, 2, fUnit2, &pCutSet2 );
        Bal_Cut_t * pCut2, * pCut2Lim = pCutSet2 + nCuts2;
        for ( pCut0 = pCutSet0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCutSet1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCutSet2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Bal_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > p->nLutSize )
                continue;
            if ( !Bal_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], p->nLutSize) )
                continue;
            assert( pCutsR[nCutsR]->Delay == Target );
            if ( Bal_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
//            if ( p->fCutMin && Bal_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fCompl0, fCompl1, fCompl2, pCutsR[nCutsR]) )
//                pCutsR[nCutsR]->Sign = Bal_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            nCutsR = Bal_SetAddCut( pCutsR, nCutsR, p->nCutNum );
        }
    }
    else
    {
        for ( pCut0 = pCutSet0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCutSet1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( Bal_CutCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
                continue;
            if ( !Bal_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], p->nLutSize) )
                continue;
            assert( pCutsR[nCutsR]->Delay == Target );
            if ( Bal_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
//            if ( p->fCutMin && Bal_CutComputeTruth(p, pCut0, pCut1, fCompl0, fCompl1, pCutsR[nCutsR], fIsXor) )
//                pCutsR[nCutsR]->Sign = Bal_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            nCutsR = Bal_SetAddCut( pCutsR, nCutsR, p->nCutNum );
        }
    }
    if ( nCutsR == 0 )
        return -1;
//printf( "%d ", nCutsR );
    Cost = ((pCutsR[0]->Delay << 4) | pCutsR[0]->nLeaves);
    // verify
    assert( nCutsR > 0 && nCutsR < p->nCutNum );
    assert( Bal_SetCheckArray(pCutsR, nCutsR) );
    // save cuts
    if ( fSave && Cost >= 0 )
    {
        pCutSet0 = ABC_CALLOC( Bal_Cut_t, p->nCutNum );
        Vec_PtrPush( p->vCutSets, pCutSet0 );
        assert( Vec_PtrSize(p->vCutSets) == Gia_ManObjNum(p->pNew) );
        for ( i = 0; i < nCutsR; i++ )
            pCutSet0[i] = *pCutsR[i];        
        for ( ; i < p->nCutNum; i++ )
            pCutSet0[i].nLeaves = BAL_NO_LEAF;
        Vec_IntPush( p->vCosts, Cost );
        assert( Vec_IntSize(p->vCosts) == Gia_ManObjNum(p->pNew) );
    }
    return Cost;
}